

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O3

int WebPPictureAlloc(WebPPicture *picture)

{
  int iVar1;
  
  if (picture == (WebPPicture *)0x0) {
    return 1;
  }
  WebPSafeFree(picture->memory_);
  WebPSafeFree(picture->memory_argb_);
  picture->argb = (uint32_t *)0x0;
  picture->argb_stride = 0;
  picture->y = (uint8_t *)0x0;
  picture->u = (uint8_t *)0x0;
  picture->v = (uint8_t *)0x0;
  picture->y_stride = 0;
  picture->uv_stride = 0;
  *(undefined8 *)&picture->uv_stride = 0;
  *(undefined8 *)((long)&picture->a + 4) = 0;
  picture->memory_ = (void *)0x0;
  picture->memory_argb_ = (void *)0x0;
  if (picture->use_argb != 0) {
    iVar1 = WebPPictureAllocARGB(picture);
    return iVar1;
  }
  iVar1 = WebPPictureAllocYUVA(picture);
  return iVar1;
}

Assistant:

int WebPPictureAlloc(WebPPicture* picture) {
  if (picture != NULL) {
    WebPPictureFree(picture);   // erase previous buffer

    if (!picture->use_argb) {
      return WebPPictureAllocYUVA(picture);
    } else {
      return WebPPictureAllocARGB(picture);
    }
  }
  return 1;
}